

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x2x.cc
# Opt level: O2

bool __thiscall
anon_unknown.dwarf_2019::DataTransform<long_double,_short>::Run
          (DataTransform<long_double,_short> *this,istream *input_stream)

{
  short sVar1;
  short sVar2;
  NumericType NVar3;
  WarningType WVar4;
  short data_to_write;
  ostream *poVar5;
  size_t *__idx;
  ulong uVar6;
  ulong uVar7;
  int iVar8;
  bool bVar9;
  longdouble in_ST0;
  longdouble lVar10;
  longdouble lVar11;
  longdouble in_ST1;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble in_ST4;
  longdouble in_ST5;
  longdouble in_ST6;
  longdouble in_ST7;
  allocator local_281;
  string *local_280;
  long local_278;
  ulong local_270;
  longdouble local_268;
  string local_250;
  string word;
  char buffer [128];
  
  local_280 = &this->print_format_;
  iVar8 = 0;
  do {
    if (this->is_ascii_input_ == true) {
      word._M_dataplus._M_p = (pointer)&word.field_2;
      word._M_string_length = 0;
      word.field_2._M_local_buf[0] = '\0';
      std::operator>>(input_stream,(string *)&word);
      bVar9 = word._M_string_length == 0;
      lVar11 = in_ST0;
      if (!bVar9) {
        std::__cxx11::stold((longdouble *)&word,(string *)0x0,__idx);
        lVar11 = in_ST1;
        in_ST1 = in_ST2;
        in_ST2 = in_ST3;
        in_ST3 = in_ST4;
        in_ST4 = in_ST5;
        in_ST5 = in_ST6;
        in_ST6 = in_ST7;
        local_268 = in_ST0;
      }
      in_ST0 = lVar11;
      std::__cxx11::string::~string((string *)&word);
      if (!bVar9) goto LAB_00135077;
      if (bVar9) {
        if (bVar9) {
LAB_00135341:
          bVar9 = true;
          if ((this->is_ascii_output_ == true) && (iVar8 % this->num_column_ != 0)) {
            std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
          }
        }
        else {
LAB_00135363:
          bVar9 = false;
        }
        return bVar9;
      }
    }
    else {
      bVar9 = sptk::ReadStream<long_double>(&local_268,input_stream);
      if (!bVar9) goto LAB_00135341;
LAB_00135077:
      sVar1 = (short)ROUND(local_268);
      data_to_write = this->minimum_value_;
      sVar2 = this->maximum_value_;
      if (data_to_write < sVar2) {
        NVar3 = this->input_numeric_type_;
        if (NVar3 == kFloatingPoint) {
          in_ST6 = in_ST5;
          if (((longdouble)data_to_write <= local_268) &&
             (data_to_write = sVar2, local_268 <= (longdouble)sVar2)) goto LAB_0013519c;
        }
        else {
          uVar6 = (ulong)sVar2;
          if (NVar3 == kUnsignedInteger) {
            lVar10 = (longdouble)9.223372e+18;
            lVar11 = (longdouble)0;
            if (lVar10 <= local_268) {
              lVar11 = lVar10;
            }
            local_270 = (ulong)ROUND(local_268 - lVar11);
            uVar7 = (ulong)(lVar10 <= local_268) << 0x3f ^ local_270;
            in_ST5 = in_ST4;
            in_ST6 = in_ST4;
            if ((ulong)(long)data_to_write <= uVar7) {
              bVar9 = uVar6 < uVar7;
              data_to_write = sVar1;
              if (bVar9) {
                data_to_write = sVar2;
              }
              goto LAB_0013519e;
            }
          }
          else {
            if (NVar3 != kSignedInteger) goto LAB_0013519c;
            local_278 = (long)ROUND(local_268);
            in_ST6 = in_ST5;
            if (data_to_write <= local_278) {
              bVar9 = (long)uVar6 < local_278;
              data_to_write = sVar1;
              if ((long)uVar6 < local_278) {
                data_to_write = sVar2;
              }
              goto LAB_0013519e;
            }
          }
        }
LAB_001351f5:
        if (this->warning_type_ != kIgnore) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&word);
          poVar5 = (ostream *)std::ostream::operator<<((ostream *)&word,iVar8);
          std::operator<<(poVar5,"th data is over the range of output type");
          std::__cxx11::string::string((string *)&local_250,"x2x",&local_281);
          sptk::PrintErrorMessage(&local_250,(ostringstream *)&word);
          std::__cxx11::string::~string((string *)&local_250);
          WVar4 = this->warning_type_;
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&word);
          if (WVar4 == kExit) goto LAB_00135363;
        }
      }
      else {
LAB_0013519c:
        bVar9 = false;
        data_to_write = sVar1;
LAB_0013519e:
        if ((bVar9) || (this->rounding_ == false)) {
          if (bVar9) goto LAB_001351f5;
        }
        else {
          in_ST6 = in_ST5;
          if (local_268 <= (longdouble)0) {
            data_to_write = (short)ROUND(local_268 + (longdouble)-0.5);
          }
          else {
            data_to_write = (short)ROUND(local_268 + (longdouble)0.5);
          }
        }
      }
      if (this->is_ascii_output_ == true) {
        bVar9 = sptk::SnPrintf<short>(data_to_write,local_280,0x80,buffer);
        if (!bVar9) goto LAB_00135363;
        std::operator<<((ostream *)&std::cout,buffer);
        if ((iVar8 + 1) % this->num_column_ == 0) {
          std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
          in_ST7 = in_ST6;
        }
        else {
          std::operator<<((ostream *)&std::cout,"\t");
          in_ST7 = in_ST6;
        }
      }
      else {
        bVar9 = sptk::WriteStream<short>(data_to_write,(ostream *)&std::cout);
        in_ST7 = in_ST6;
        if (!bVar9) goto LAB_00135363;
      }
    }
    iVar8 = iVar8 + 1;
  } while( true );
}

Assistant:

bool Run(std::istream* input_stream) const override {
    char buffer[kBufferSize];
    int index(0);
    for (;; ++index) {
      // Read.
      T1 input_data;
      if (is_ascii_input_) {
        std::string word;
        *input_stream >> word;
        if (word.empty()) break;
        try {
          input_data = static_cast<T1>(std::stold(word));
        } catch (std::invalid_argument&) {
          return false;
        }
      } else {
        if (!sptk::ReadStream(&input_data, input_stream)) {
          break;
        }
      }

      // Convert.
      T2 output_data(static_cast<T2>(input_data));

      bool is_clipped(false);
      {
        // Clipping.
        if (minimum_value_ < maximum_value_) {
          if (kSignedInteger == input_numeric_type_) {
            if (static_cast<std::int64_t>(input_data) <
                static_cast<std::int64_t>(minimum_value_)) {
              output_data = minimum_value_;
              is_clipped = true;
            } else if (static_cast<std::int64_t>(maximum_value_) <
                       static_cast<std::int64_t>(input_data)) {
              output_data = maximum_value_;
              is_clipped = true;
            }
          } else if (kUnsignedInteger == input_numeric_type_) {
            if (static_cast<std::uint64_t>(input_data) <
                static_cast<std::uint64_t>(minimum_value_)) {
              output_data = minimum_value_;
              is_clipped = true;
            } else if (static_cast<std::uint64_t>(maximum_value_) <
                       static_cast<std::uint64_t>(input_data)) {
              output_data = maximum_value_;
              is_clipped = true;
            }
          } else if (kFloatingPoint == input_numeric_type_) {
            if (static_cast<long double>(input_data) <
                static_cast<long double>(minimum_value_)) {
              output_data = minimum_value_;
              is_clipped = true;
            } else if (static_cast<long double>(maximum_value_) <
                       static_cast<long double>(input_data)) {
              output_data = maximum_value_;
              is_clipped = true;
            }
          }
        }

        // Rounding.
        if (rounding_ && !is_clipped) {
          if (0.0 < input_data) {
            output_data = static_cast<T2>(input_data + 0.5);
          } else {
            output_data = static_cast<T2>(input_data - 0.5);
          }
        }
      }

      if (is_clipped && kIgnore != warning_type_) {
        std::ostringstream error_message;
        error_message << index << "th data is over the range of output type";
        sptk::PrintErrorMessage("x2x", error_message);
        if (kExit == warning_type_) return false;
      }

      // Write output.
      if (is_ascii_output_) {
        if (!sptk::SnPrintf(output_data, print_format_, sizeof(buffer),
                            buffer)) {
          return false;
        }
        std::cout << buffer;
        if (0 == (index + 1) % num_column_) {
          std::cout << std::endl;
        } else {
          std::cout << "\t";
        }
      } else {
        if (!sptk::WriteStream(output_data, &std::cout)) {
          return false;
        }
      }
    }

    if (is_ascii_output_ && 0 != index % num_column_) {
      std::cout << std::endl;
    }

    return true;
  }